

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# getcoluj.c
# Opt level: O1

int fffi1u4(uchar *input,long ntodo,double scale,double zero,int nullcheck,uchar tnull,
           unsigned_long nullval,char *nullarray,int *anynull,unsigned_long *output,int *status)

{
  ulong uVar1;
  long lVar2;
  double dVar3;
  
  if (nullcheck == 0) {
    if (scale != 1.0 || zero != 0.0) {
      if (0 < ntodo) {
        lVar2 = 0;
        do {
          dVar3 = (double)input[lVar2] * scale + zero;
          if (-0.49 <= dVar3) {
            if (dVar3 <= 1.844674407370955e+19) {
              uVar1 = (long)(dVar3 - 9.223372036854776e+18) & (long)dVar3 >> 0x3f | (long)dVar3;
            }
            else {
              *status = -0xb;
              uVar1 = 0xffffffffffffffff;
            }
          }
          else {
            *status = -0xb;
            uVar1 = 0;
          }
          output[lVar2] = uVar1;
          lVar2 = lVar2 + 1;
        } while (ntodo != lVar2);
      }
    }
    else if (0 < ntodo) {
      lVar2 = 0;
      do {
        output[lVar2] = (ulong)input[lVar2];
        lVar2 = lVar2 + 1;
      } while (ntodo != lVar2);
    }
  }
  else if (scale != 1.0 || zero != 0.0) {
    if (0 < ntodo) {
      lVar2 = 0;
      do {
        if (input[lVar2] == tnull) {
          *anynull = 1;
          if (nullcheck == 1) {
            output[lVar2] = nullval;
          }
          else {
            nullarray[lVar2] = '\x01';
          }
        }
        else {
          dVar3 = (double)input[lVar2] * scale + zero;
          if (-0.49 <= dVar3) {
            if (dVar3 <= 1.844674407370955e+19) {
              output[lVar2] =
                   (long)(dVar3 - 9.223372036854776e+18) & (long)dVar3 >> 0x3f | (long)dVar3;
            }
            else {
              *status = -0xb;
              output[lVar2] = 0xffffffffffffffff;
            }
          }
          else {
            *status = -0xb;
            output[lVar2] = 0;
          }
        }
        lVar2 = lVar2 + 1;
      } while (ntodo != lVar2);
    }
  }
  else if (0 < ntodo) {
    lVar2 = 0;
    do {
      if (input[lVar2] == tnull) {
        *anynull = 1;
        if (nullcheck == 1) {
          output[lVar2] = nullval;
        }
        else {
          nullarray[lVar2] = '\x01';
        }
      }
      else {
        output[lVar2] = (ulong)input[lVar2];
      }
      lVar2 = lVar2 + 1;
    } while (ntodo != lVar2);
  }
  return *status;
}

Assistant:

int fffi1u4(unsigned char *input, /* I - array of values to be converted     */
            long ntodo,           /* I - number of elements in the array     */
            double scale,         /* I - FITS TSCALn or BSCALE value         */
            double zero,          /* I - FITS TZEROn or BZERO  value         */
            int nullcheck,        /* I - null checking code; 0 = don't check */
                                  /*     1:set null pixels = nullval         */
                                  /*     2: if null pixel, set nullarray = 1 */
            unsigned char tnull,  /* I - value of FITS TNULLn keyword if any */
   unsigned long nullval,         /* I - set null pixels, if nullcheck = 1   */
            char *nullarray,      /* I - bad pixel array, if nullcheck = 2   */
            int  *anynull,        /* O - set to 1 if any pixels are null     */
   unsigned long *output,         /* O - array of converted pixels           */
            int *status)          /* IO - error status                       */
/*
  Copy input to output following reading of the input from a FITS file.
  Check for null values and do datatype conversion and scaling if required.
  The nullcheck code value determines how any null values in the input array
  are treated.  A null value is an input pixel that is equal to tnull.  If 
  nullcheck = 0, then no checking for nulls is performed and any null values
  will be transformed just like any other pixel.  If nullcheck = 1, then the
  output pixel will be set = nullval if the corresponding input pixel is null.
  If nullcheck = 2, then if the pixel is null then the corresponding value of
  nullarray will be set to 1; the value of nullarray for non-null pixels 
  will = 0.  The anynull parameter will be set = 1 if any of the returned
  pixels are null, otherwise anynull will be returned with a value = 0;
*/
{
    long ii;
    double dvalue;

    if (nullcheck == 0)     /* no null checking required */
    {
        if (scale == 1. && zero == 0.)      /* no scaling */
        {       
            for (ii = 0; ii < ntodo; ii++)
                output[ii] = (unsigned long) input[ii];  /* copy input */
        }
        else             /* must scale the data */
        {
            for (ii = 0; ii < ntodo; ii++)
            {
                dvalue = input[ii] * scale + zero;

                if (dvalue < DULONG_MIN)
                {
                    *status = OVERFLOW_ERR;
                    output[ii] = 0;
                }
                else if (dvalue > DULONG_MAX)
                {
                    *status = OVERFLOW_ERR;
                    output[ii] = ULONG_MAX;
                }
                else
                    output[ii] = (unsigned long) dvalue;
            }
        }
    }
    else        /* must check for null values */
    {
        if (scale == 1. && zero == 0.)  /* no scaling */
        {       
            for (ii = 0; ii < ntodo; ii++)
            {
                if (input[ii] == tnull)
                {
                    *anynull = 1;
                    if (nullcheck == 1)
                        output[ii] = nullval;
                    else
                        nullarray[ii] = 1;
                }
                else
                    output[ii] = (unsigned long) input[ii];
            }
        }
        else                  /* must scale the data */
        {
            for (ii = 0; ii < ntodo; ii++)
            {
                if (input[ii] == tnull)
                {
                    *anynull = 1;
                    if (nullcheck == 1)
                        output[ii] = nullval;
                    else
                        nullarray[ii] = 1;
                }
                else
                {
                    dvalue = input[ii] * scale + zero;

                    if (dvalue < DULONG_MIN)
                    {
                        *status = OVERFLOW_ERR;
                        output[ii] = 0;
                    }
                    else if (dvalue > DULONG_MAX)
                    {
                        *status = OVERFLOW_ERR;
                        output[ii] = ULONG_MAX;
                    }
                    else
                        output[ii] = (unsigned long) dvalue;
                }
            }
        }
    }
    return(*status);
}